

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

uchar __thiscall IDisk::GetNextByteForRev(IDisk *this,int side,uint track,uint offset,int rev)

{
  int local_28;
  uchar b;
  int i;
  uint uStack_1c;
  uchar return_value;
  int rev_local;
  uint offset_local;
  uint track_local;
  int side_local;
  IDisk *this_local;
  
  b = '\0';
  uStack_1c = offset + 1;
  for (local_28 = 0; local_28 < 0x10; local_28 = local_28 + 2) {
    if (this->side_[side].tracks[track].revolution[rev].size <= uStack_1c) {
      uStack_1c = uStack_1c - this->side_[side].tracks[track].revolution[rev].size;
    }
    b = b << 1 | this->side_[side].tracks[track].revolution[rev].bitfield[uStack_1c] & 1;
    uStack_1c = uStack_1c + 2;
  }
  return b;
}

Assistant:

unsigned char IDisk::GetNextByteForRev(int side, unsigned int track, unsigned int offset, int rev)
{
   unsigned char return_value = 0;

   //
   offset++;
   for (int i = 0; i < 16; i += 2)
   {
      return_value <<= 1;
      if (offset >= side_[side].tracks[track].revolution[rev].size)
         offset = offset - side_[side].tracks[track].revolution[rev].size;

      unsigned char b = side_[side].tracks[track].revolution[rev].bitfield[offset];

      return_value |= b & 0x1;
      offset += 2;
   }

   return return_value;
}